

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# current_transaction_id.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::CurrentTransactionIdBind
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  MetaTransaction *pMVar1;
  LogicalType LStack_c8;
  LogicalType local_b0;
  element_type *local_98 [8];
  Value transaction_id;
  
  LogicalType::LogicalType(&local_b0,SQLNULL);
  Value::Value(&transaction_id,&local_b0);
  LogicalType::~LogicalType(&local_b0);
  if (bound_function[1].deserialize == (function_deserialize_t)0x0) {
    LogicalType::LogicalType(&LStack_c8,SQLNULL);
    Value::Value((Value *)local_98,&LStack_c8);
    Value::operator=(&transaction_id,(Value *)local_98);
    Value::~Value((Value *)local_98);
    LogicalType::~LogicalType(&LStack_c8);
  }
  else {
    pMVar1 = TransactionContext::ActiveTransaction
                       ((TransactionContext *)&bound_function[1].get_modified_databases);
    Value::UBIGINT((Value *)local_98,pMVar1->global_transaction_id);
    Value::operator=(&transaction_id,(Value *)local_98);
    Value::~Value((Value *)local_98);
  }
  make_uniq<duckdb::CurrentTransactionIdData,duckdb::Value&>((duckdb *)local_98,&transaction_id);
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_98[0];
  Value::~Value(&transaction_id);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)context;
}

Assistant:

unique_ptr<FunctionData> CurrentTransactionIdBind(ClientContext &context, ScalarFunction &bound_function,
                                                  vector<unique_ptr<Expression>> &arguments) {
	Value transaction_id;
	if (context.transaction.HasActiveTransaction()) {
		transaction_id = Value::UBIGINT(context.transaction.ActiveTransaction().global_transaction_id);
	} else {
		transaction_id = Value();
	}
	return make_uniq<CurrentTransactionIdData>(transaction_id);
}